

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.h
# Opt level: O2

void __thiscall PresolveComponentData::~PresolveComponentData(PresolveComponentData *this)

{
  this->_vptr_PresolveComponentData = (_func_int **)&PTR__PresolveComponentData_004328d0;
  std::_Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::~_Vector_base
            ((_Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_> *)
             &this->presolve_log_);
  HighsBasis::~HighsBasis(&this->recovered_basis_);
  HighsSolution::~HighsSolution(&this->recovered_solution_);
  presolve::HighsPostsolveStack::~HighsPostsolveStack(&this->postSolveStack);
  HighsLp::~HighsLp(&this->reduced_lp_);
  return;
}

Assistant:

virtual ~PresolveComponentData() = default;